

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O1

void __thiscall
t_lua_generator::generate_service_client(t_lua_generator *this,ostream *out,t_service *tservice)

{
  int *piVar1;
  t_service *ptVar2;
  t_function *tfunction;
  pointer pcVar3;
  t_struct *ptVar4;
  string prefix;
  int iVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  undefined4 extraout_var_00;
  t_type *type;
  long lVar7;
  char *pcVar8;
  pointer pptVar9;
  pointer pptVar10;
  pointer pptVar11;
  string argname;
  string classname;
  string sig;
  string funcname;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  undefined8 in_stack_fffffffffffffde8;
  _Alloc_hider in_stack_fffffffffffffdf0;
  size_type in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  string local_1f0;
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  string local_1b0;
  char *local_190;
  long local_188;
  char local_180 [16];
  pointer local_170;
  vector<t_function_*,_std::allocator<t_function_*>_> local_168;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar5 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  local_1d0 = local_1c0;
  lVar7 = *(long *)CONCAT44(extraout_var,iVar5);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,lVar7,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar7);
  pcVar8 = "Client";
  std::__cxx11::string::append((char *)&local_1d0);
  ptVar2 = tservice->extends_;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(out,local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," = __TObject.new(",0x11);
  if (ptVar2 == (t_service *)0x0) {
    lVar7 = 9;
    pcVar8 = "__TClient";
    poVar6 = out;
  }
  else {
    iVar5 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)CONCAT44(extraout_var_00,iVar5),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar5))[1]);
    lVar7 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar8,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>(out,", {",3);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  __type = \'",0xc);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1d0,local_1c8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"})",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_168,&tservice->functions_)
  ;
  pptVar9 = local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      tfunction = *pptVar9;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
      prefix._M_string_length = (size_type)in_stack_fffffffffffffdf0._M_p;
      prefix._M_dataplus._M_p = (pointer)in_stack_fffffffffffffde8;
      prefix.field_2._M_allocated_capacity = in_stack_fffffffffffffdf8;
      prefix.field_2._8_8_ = in_stack_fffffffffffffe00;
      function_signature(&local_1b0,this,tfunction,prefix);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      local_190 = local_180;
      pcVar3 = ((*pptVar9)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,pcVar3,pcVar3 + ((*pptVar9)->name_)._M_string_length);
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"function ",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1d0,local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"self:send_",10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffdf0,(t_generator *)this);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
      if (in_stack_fffffffffffffdf0._M_p != &stack0xfffffffffffffe00) {
        operator_delete(in_stack_fffffffffffffdf0._M_p);
      }
      if ((*pptVar9)->oneway_ == false) {
        iVar5 = (*((*pptVar9)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar5 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(out,"return ",7);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"self:recv_",10);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar6 = t_generator::indent((t_generator *)this,out);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"function ",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1d0,local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":send_",6);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"self.oprot:writeMessageBegin(\'",0x1e);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_190,local_188);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\', ",3);
      pcVar8 = "TMessageType.CALL";
      if ((*pptVar9)->oneway_ != false) {
        pcVar8 = "TMessageType.ONEWAY";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,pcVar8,(ulong)(*pptVar9)->oneway_ * 2 + 0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", self._seqid)",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"local args = ",0xd);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_190,local_188);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_args:new{}",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      ptVar4 = (*pptVar9)->arglist_;
      local_170 = pptVar9;
      for (pptVar10 = (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pptVar10 !=
          (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar10 = pptVar10 + 1) {
        in_stack_fffffffffffffdf0._M_p = &stack0xfffffffffffffe00;
        pcVar3 = ((*pptVar10)->name_)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&stack0xfffffffffffffdf0,pcVar3,
                   pcVar3 + ((*pptVar10)->name_)._M_string_length);
        if ((*pptVar10)->value_ == (t_const_value *)0x0) {
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"args.",5);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        else {
          type = t_type::get_true_type((*pptVar10)->type_);
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if ",3);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ~= nil then",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"args.",5);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"else",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"args.",5);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
          render_const_value_abi_cxx11_(&local_1f0,this,type,(*pptVar10)->value_);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar6 = t_generator::indent((t_generator *)this,out);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        }
        if (in_stack_fffffffffffffdf0._M_p != &stack0xfffffffffffffe00) {
          operator_delete(in_stack_fffffffffffffdf0._M_p);
        }
      }
      poVar6 = t_generator::indent((t_generator *)this,out);
      pptVar11 = local_170;
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"args:write(self.oprot)",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"self.oprot:writeMessageEnd()",0x1c)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"self.oprot.trans:flush()",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar6 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((*pptVar11)->oneway_ == false) {
        poVar6 = t_generator::indent((t_generator *)this,out);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"function ",9);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1d0,local_1c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":recv_",6);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffdf0,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"local fname, mtype, rseqid = self.iprot:",0x28);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"readMessageBegin()",0x12);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"if mtype == TMessageType.EXCEPTION then",0x27);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"  local x = TApplicationException:new{}",0x27);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  x:read(self.iprot)",0x14);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"  self.iprot:readMessageEnd()",0x1d);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  error(x)",10);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_110._M_dataplus._M_p,local_110._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"local result = ",0xf);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_190,local_188);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_result:new{}",0xd);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"result:read(self.iprot)",0x17);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_150,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_150._M_dataplus._M_p,local_150._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"self.iprot:readMessageEnd()",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
        if (in_stack_fffffffffffffdf0._M_p != &stack0xfffffffffffffe00) {
          operator_delete(in_stack_fffffffffffffdf0._M_p);
        }
        iVar5 = (*((*pptVar11)->returntype_->super_t_doc)._vptr_t_doc[4])();
        if ((char)iVar5 == '\0') {
          t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffdf0,(t_generator *)this);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"if result.success ~= nil then",0x1d);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  return result.success",0x17);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          if (in_stack_fffffffffffffdf0._M_p != &stack0xfffffffffffffe00) {
            operator_delete(in_stack_fffffffffffffdf0._M_p);
          }
          ptVar4 = (*pptVar11)->xceptions_;
          for (pptVar10 = (ptVar4->members_).
                          super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
              pptVar10 !=
              (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish; pptVar10 = pptVar10 + 1) {
            t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffdf0,(t_generator *)this);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (out,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"elseif result.",0xe);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,((*pptVar10)->name_)._M_dataplus._M_p,
                                ((*pptVar10)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," then",5);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                                ::endl_abi_cxx11_._M_string_length);
            t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  error(result.",0xf);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,((*pptVar10)->name_)._M_dataplus._M_p,
                                ((*pptVar10)->name_)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            if (in_stack_fffffffffffffdf0._M_p != &stack0xfffffffffffffe00) {
              operator_delete(in_stack_fffffffffffffdf0._M_p);
            }
          }
          t_generator::indent_abi_cxx11_((string *)&stack0xfffffffffffffdf0,(t_generator *)this);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffdf8);
          pptVar11 = local_170;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"error(TApplicationException:new{errorCode = ",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,"TApplicationException.MISSING_RESULT})",0x26);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          if (in_stack_fffffffffffffdf0._M_p != &stack0xfffffffffffffe00) {
            operator_delete(in_stack_fffffffffffffdf0._M_p);
          }
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar6 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"end",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if (local_190 != local_180) {
        operator_delete(local_190);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      pptVar9 = pptVar11 + 1;
    } while (pptVar11 + 1 !=
             local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  return;
}

Assistant:

void t_lua_generator::generate_service_client(ostream& out, t_service* tservice) {
  string classname = tservice->get_name() + "Client";
  t_service* extends_s = tservice->get_extends();

  // Client object definition
  out << classname << " = __TObject.new(";
  if (extends_s != nullptr) {
    out << extends_s->get_name() << "Client";
  } else {
    out << "__TClient";
  }
  out << ", {" << endl << "  __type = '" << classname << "'" << endl << "})" << endl;

  // Send/Recv functions
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    string sig = function_signature(*f_iter);
    string funcname = (*f_iter)->get_name();

    // Wrapper function
    indent(out) << endl << "function " << classname << ":" << sig << endl;
    indent_up();

    indent(out) << "self:send_" << sig << endl << indent();
    if (!(*f_iter)->is_oneway()) {
      if (!(*f_iter)->get_returntype()->is_void()) {
        out << "return ";
      }
      out << "self:recv_" << sig << endl;
    }

    indent_down();
    indent(out) << "end" << endl;

    // Send function
    indent(out) << endl << "function " << classname << ":send_" << sig << endl;
    indent_up();

    indent(out) << "self.oprot:writeMessageBegin('" << funcname << "', "
                << ((*f_iter)->is_oneway() ? "TMessageType.ONEWAY" : "TMessageType.CALL")
                << ", self._seqid)" << endl;
    indent(out) << "local args = " << funcname << "_args:new{}" << endl;

    // Set the args
    const vector<t_field*>& args = (*f_iter)->get_arglist()->get_members();
    vector<t_field*>::const_iterator fld_iter;
    for (fld_iter = args.begin(); fld_iter != args.end(); ++fld_iter) {
      std::string argname = (*fld_iter)->get_name();
      if ((*fld_iter)->get_value() != nullptr) {
        // Insert default value for nil arguments
        t_type* type = get_true_type((*fld_iter)->get_type());
        indent(out) << "if " << argname << " ~= nil then" << endl;
        indent_up();
        indent(out) << "args." << argname << " = " << argname << endl;
        indent_down();
        indent(out) << "else" << endl;
        indent_up();
        indent(out) << "args." << argname << " = " << render_const_value(type, (*fld_iter)->get_value()) << endl;
        indent_down();
        indent(out) << "end" << endl;
      } else {
        indent(out) << "args." << argname << " = " << argname << endl;
      }
    }

    indent(out) << "args:write(self.oprot)" << endl;
    indent(out) << "self.oprot:writeMessageEnd()" << endl;
    indent(out) << "self.oprot.trans:flush()" << endl;

    indent_down();
    indent(out) << "end" << endl;

    // Recv function
    if (!(*f_iter)->is_oneway()) {
      indent(out) << endl << "function " << classname << ":recv_" << sig << endl;
      indent_up();

      out << indent() << "local fname, mtype, rseqid = self.iprot:"
          << "readMessageBegin()" << endl << indent() << "if mtype == TMessageType.EXCEPTION then"
          << endl << indent() << "  local x = TApplicationException:new{}" << endl << indent()
          << "  x:read(self.iprot)" << endl << indent() << "  self.iprot:readMessageEnd()" << endl
          << indent() << "  error(x)" << endl << indent() << "end" << endl << indent()
          << "local result = " << funcname << "_result:new{}" << endl << indent()
          << "result:read(self.iprot)" << endl << indent() << "self.iprot:readMessageEnd()" << endl;

      // Return the result if it's not a void function
      if (!(*f_iter)->get_returntype()->is_void()) {
        out << indent() << "if result.success ~= nil then" << endl << indent() << "  return result.success"
            << endl;

        // Throw custom exceptions
        const std::vector<t_field*>& xf = (*f_iter)->get_xceptions()->get_members();
        vector<t_field*>::const_iterator x_iter;
        for (x_iter = xf.begin(); x_iter != xf.end(); ++x_iter) {
          out << indent() << "elseif result." << (*x_iter)->get_name() << " then" << endl
              << indent() << "  error(result." << (*x_iter)->get_name() << ")" << endl;
        }

        out << indent() << "end" << endl << indent()
            << "error(TApplicationException:new{errorCode = "
            << "TApplicationException.MISSING_RESULT})" << endl;
      }

      indent_down();
      indent(out) << "end" << endl;
    }
  }
}